

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqtable.cpp
# Opt level: O2

bool __thiscall SQTable::NewSlot(SQTable *this,SQObjectPtr *key,SQObjectPtr *val)

{
  _HashNode *p_Var1;
  SQHash SVar2;
  _HashNode *this_00;
  _HashNode *p_Var3;
  _HashNode *p_Var4;
  ulong hash;
  SQObjectPtr *key_00;
  _HashNode *obj;
  
  do {
    SVar2 = HashObj(&key->super_SQObject);
    hash = this->_numofnodes - 1U & SVar2;
    this_00 = _Get(this,key,hash);
    if (this_00 != (_HashNode *)0x0) {
      SQObjectPtr::operator=(&this_00->val,val);
LAB_0011967f:
      return this_00 == (_HashNode *)0x0;
    }
    p_Var4 = this->_nodes;
    obj = p_Var4 + hash;
    if (p_Var4[hash].key.super_SQObject._type != OT_NULL) {
      key_00 = &p_Var4[hash].key;
      p_Var4 = this->_firstfree;
      SVar2 = HashObj(&key_00->super_SQObject);
      if ((p_Var4 < obj) &&
         (p_Var1 = this->_nodes + (this->_numofnodes - 1U & SVar2),
         this->_nodes + (this->_numofnodes - 1U & SVar2) != obj)) {
        do {
          p_Var3 = p_Var1;
          p_Var1 = p_Var3->next;
        } while (p_Var1 != obj);
        p_Var3->next = p_Var4;
        SQObjectPtr::operator=(&p_Var4->key,key_00);
        SQObjectPtr::operator=(&p_Var4->val,&obj->val);
        p_Var4->next = obj->next;
        SQObjectPtr::Null(key_00);
        SQObjectPtr::Null(&obj->val);
        obj->next = (_HashNode *)0x0;
      }
      else {
        p_Var4->next = obj->next;
        obj->next = p_Var4;
        obj = p_Var4;
      }
    }
    SQObjectPtr::operator=(&obj->key,key);
    p_Var4 = this->_firstfree;
    while( true ) {
      if (((p_Var4->key).super_SQObject._type == OT_NULL) && (p_Var4->next == (_HashNode *)0x0)) {
        SQObjectPtr::operator=(&obj->val,val);
        this->_usednodes = this->_usednodes + 1;
        goto LAB_0011967f;
      }
      if (p_Var4 == this->_nodes) break;
      p_Var4 = p_Var4 + -1;
      this->_firstfree = p_Var4;
    }
    Rehash(this,true);
  } while( true );
}

Assistant:

bool SQTable::NewSlot(const SQObjectPtr &key,const SQObjectPtr &val)
{
    assert(sq_type(key) != OT_NULL);
    SQHash h = HashObj(key) & (_numofnodes - 1);
    _HashNode *n = _Get(key, h);
    if (n) {
        n->val = val;
        return false;
    }
    _HashNode *mp = &_nodes[h];
    n = mp;


    //key not found I'll insert it
    //main pos is not free

    if(sq_type(mp->key) != OT_NULL) {
        n = _firstfree;  /* get a free place */
        SQHash mph = HashObj(mp->key) & (_numofnodes - 1);
        _HashNode *othern;  /* main position of colliding node */

        if (mp > n && (othern = &_nodes[mph]) != mp){
            /* yes; move colliding node into free position */
            while (othern->next != mp){
                assert(othern->next != NULL);
                othern = othern->next;  /* find previous */
            }
            othern->next = n;  /* redo the chain with `n' in place of `mp' */
            n->key = mp->key;
            n->val = mp->val;/* copy colliding node into free pos. (mp->next also goes) */
            n->next = mp->next;
            mp->key.Null();
            mp->val.Null();
            mp->next = NULL;  /* now `mp' is free */
        }
        else{
            /* new node will go into free position */
            n->next = mp->next;  /* chain new position */
            mp->next = n;
            mp = n;
        }
    }
    mp->key = key;

    for (;;) {  /* correct `firstfree' */
        if (sq_type(_firstfree->key) == OT_NULL && _firstfree->next == NULL) {
            mp->val = val;
            _usednodes++;
            return true;  /* OK; table still has a free place */
        }
        else if (_firstfree == _nodes) break;  /* cannot decrement from here */
        else (_firstfree)--;
    }
    Rehash(true);
    return NewSlot(key, val);
}